

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeMmatrixGlobal
          (ChElementBeamANCF_3243 *this,ChMatrixRef *M)

{
  long row;
  long row_00;
  Scalar SVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  long lVar4;
  long col;
  long lVar5;
  long lVar6;
  ChVectorN<double,_(NSF_*_(NSF___1))___2>_conflict *this_00;
  ulong index;
  int local_84;
  
  Eigen::
  DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
  setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           *)M);
  this_00 = &this->m_MassMatrix;
  lVar5 = 2;
  local_84 = 0;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    row = lVar4 * 3 + 1;
    row_00 = lVar4 * 3 + 2;
    lVar6 = 0;
    for (col = lVar5; col != 0x1a; col = col + 3) {
      index = (ulong)(uint)(local_84 + (int)lVar6);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>,_1> *)this_00,
                          index);
      SVar1 = *pSVar2;
      pSVar3 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             *)M,lVar4 * 3,col + -2);
      *pSVar3 = SVar1;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>,_1> *)this_00,
                          index);
      SVar1 = *pSVar2;
      pSVar3 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             *)M,row,col + -1);
      *pSVar3 = SVar1;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>,_1> *)this_00,
                          index);
      SVar1 = *pSVar2;
      pSVar3 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             *)M,row_00,col);
      *pSVar3 = SVar1;
      if (lVar6 != 0) {
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>,_1> *)this_00,
                            index);
        SVar1 = *pSVar2;
        pSVar3 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)M,col + -2,lVar4 * 3);
        *pSVar3 = SVar1;
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>,_1> *)this_00,
                            index);
        SVar1 = *pSVar2;
        pSVar3 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)M,col + -1,row);
        *pSVar3 = SVar1;
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>,_1> *)this_00,
                            index);
        SVar1 = *pSVar2;
        pSVar3 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)M,col,row_00);
        *pSVar3 = SVar1;
      }
      lVar6 = lVar6 + 1;
    }
    local_84 = local_84 + (int)lVar6;
    lVar5 = lVar5 + 3;
  }
  return;
}

Assistant:

void ChElementBeamANCF_3243::ComputeMmatrixGlobal(ChMatrixRef M) {
    M.setZero();

    // Mass Matrix is Stored in Compact Upper Triangular Form
    // Expand it out into its Full Sparse Symmetric Form
    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            M(3 * i, 3 * j) = m_MassMatrix(idx);
            M(3 * i + 1, 3 * j + 1) = m_MassMatrix(idx);
            M(3 * i + 2, 3 * j + 2) = m_MassMatrix(idx);
            if (i != j) {
                M(3 * j, 3 * i) = m_MassMatrix(idx);
                M(3 * j + 1, 3 * i + 1) = m_MassMatrix(idx);
                M(3 * j + 2, 3 * i + 2) = m_MassMatrix(idx);
            }
            idx++;
        }
    }
}